

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_tri_centroid(REF_GRID ref_grid,REF_INT *nodes,REF_DBL *uv)

{
  REF_CELL pRVar1;
  REF_GEOM ref_geom;
  uint uVar2;
  long lVar3;
  REF_INT sens;
  REF_DBL node_uv [2];
  REF_INT local_4c;
  double local_48;
  double dStack_40;
  
  pRVar1 = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  *uv = 0.0;
  uv[1] = 0.0;
  if (0 < pRVar1->node_per) {
    lVar3 = 0;
    do {
      uVar2 = ref_geom_cell_tuv(ref_geom,nodes[lVar3],nodes,2,&local_48,&local_4c);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x6c5,"ref_geom_tri_centroid",(ulong)uVar2,"cell node uv");
        ref_geom_tec(ref_grid,"ref_geom_tri_centroid_error.tec");
        return uVar2;
      }
      *uv = local_48 * 0.3333333333333333 + *uv;
      uv[1] = dStack_40 * 0.3333333333333333 + uv[1];
      lVar3 = lVar3 + 1;
    } while (lVar3 < pRVar1->node_per);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_centroid(REF_GRID ref_grid, REF_INT *nodes,
                                         REF_DBL *uv) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell_node;
  REF_DBL node_uv[2];
  REF_INT sens;
  uv[0] = 0.0;
  uv[1] = 0.0;
  each_ref_cell_cell_node(ref_cell, cell_node) {
    RSB(ref_geom_cell_tuv(ref_geom, nodes[cell_node], nodes, REF_GEOM_FACE,
                          node_uv, &sens),
        "cell node uv",
        { ref_geom_tec(ref_grid, "ref_geom_tri_centroid_error.tec"); });
    uv[0] += (1.0 / 3.0) * node_uv[0];
    uv[1] += (1.0 / 3.0) * node_uv[1];
  }

  return REF_SUCCESS;
}